

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

void __thiscall PatternBlock::PatternBlock(PatternBlock *this,int4 off,uintm msk,uintm val)

{
  uintm local_20;
  uintm local_1c;
  
  (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->offset = off;
  local_20 = val;
  local_1c = msk;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->maskvec,&local_1c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->valvec,&local_20);
  this->nonzerosize = 4;
  normalize(this);
  return;
}

Assistant:

PatternBlock::PatternBlock(int4 off,uintm msk,uintm val)

{				// Define mask and value pattern, confined to one uintm
  offset = off;
  maskvec.push_back(msk);
  valvec.push_back(val);
  nonzerosize = sizeof(uintm);	// Assume all non-zero bytes before normalization
  normalize();
}